

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O0

int csp_conn_flush_rx_queue(csp_conn_t *conn)

{
  int iVar1;
  csp_packet_t *packet;
  void *in_stack_ffffffffffffffe8;
  csp_queue_handle_t in_stack_fffffffffffffff0;
  
  while (iVar1 = csp_queue_dequeue(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0),
        iVar1 == 0) {
    if (in_stack_fffffffffffffff0 != (csp_queue_handle_t)0x0) {
      csp_buffer_free(in_stack_fffffffffffffff0);
    }
  }
  return 0;
}

Assistant:

static int csp_conn_flush_rx_queue(csp_conn_t * conn) {

	csp_packet_t * packet;

	/* Flush packet queues */
	while (csp_queue_dequeue(conn->rx_queue, &packet, 0) == CSP_QUEUE_OK) {
		if (packet != NULL) {
			csp_buffer_free(packet);
		}
	}

	return CSP_ERR_NONE;
}